

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool flatbuffers::DirExists(char *name)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat file_info;
  char *name_local;
  
  file_info.__glibc_reserved[2] = (__syscall_slong_t)name;
  iVar1 = stat(name,(stat *)local_a8);
  name_local._7_1_ = iVar1 == 0 && ((uint)file_info.st_nlink & 0x4000) != 0;
  return name_local._7_1_;
}

Assistant:

bool DirExists(const char *name) {
  // clang-format off

  #ifdef _WIN32
    #define flatbuffers_stat _stat
    #define FLATBUFFERS_S_IFDIR _S_IFDIR
  #else
    #define flatbuffers_stat stat
    #define FLATBUFFERS_S_IFDIR S_IFDIR
  #endif
  // clang-format on
  struct flatbuffers_stat file_info;
  if (flatbuffers_stat(name, &file_info) != 0) return false;
  return (file_info.st_mode & FLATBUFFERS_S_IFDIR) != 0;
}